

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.h
# Opt level: O0

GradientPoint * GradientPoint::fromHSV(float u,float h,float s,float v)

{
  GradientPoint *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  GradientPoint *out;
  float t;
  float q;
  float p;
  float f;
  int i;
  float local_10;
  float local_c;
  float local_8;
  
  GradientPoint(in_RDI);
  in_RDI->units = in_XMM0_Da;
  if (((1.0 < in_XMM1_Da) || (1.0 < in_XMM2_Da)) ||
     (local_10 = in_XMM3_Da, local_c = in_XMM2_Da, local_8 = in_XMM1_Da, 1.0 < in_XMM3_Da)) {
    local_8 = in_XMM1_Da / 360.0;
    local_c = in_XMM2_Da / 100.0;
    local_10 = in_XMM3_Da / 100.0;
  }
  in_RDI->hsv[0] = local_8;
  in_RDI->hsv[1] = local_c;
  in_RDI->hsv[2] = local_10;
  fVar1 = local_8 * 6.0 - (float)(int)(local_8 * 6.0);
  fVar2 = local_10 * (1.0 - local_c);
  fVar3 = local_10 * (1.0 - fVar1 * local_c);
  fVar1 = local_10 * (1.0 - (1.0 - fVar1) * local_c);
  switch((int)(local_8 * 6.0) % 6) {
  case 0:
    in_RDI->rgb[0] = local_10;
    in_RDI->rgb[1] = fVar1;
    in_RDI->rgb[2] = fVar2;
    break;
  case 1:
    in_RDI->rgb[0] = fVar3;
    in_RDI->rgb[1] = local_10;
    in_RDI->rgb[2] = fVar2;
    break;
  case 2:
    in_RDI->rgb[0] = fVar2;
    in_RDI->rgb[1] = local_10;
    in_RDI->rgb[2] = fVar1;
    break;
  case 3:
    in_RDI->rgb[0] = fVar2;
    in_RDI->rgb[1] = fVar3;
    in_RDI->rgb[2] = local_10;
    break;
  case 4:
    in_RDI->rgb[0] = fVar1;
    in_RDI->rgb[1] = fVar2;
    in_RDI->rgb[2] = local_10;
    break;
  case 5:
    in_RDI->rgb[0] = local_10;
    in_RDI->rgb[1] = fVar2;
    in_RDI->rgb[2] = fVar3;
  }
  return in_RDI;
}

Assistant:

static const GradientPoint fromHSV(float u, float h, float s, float v) {
    GradientPoint out;
    out.units = u;

    // Rescale if max input range exceeds 1
    if (h > 1 || s > 1 || v > 1) {
      h /= 360;
      s /= 100;
      v /= 100;
    }

    out.hsv[0] = h;
    out.hsv[1] = s;
    out.hsv[2] = v;

    // Perform HSV->RGB conversion
    int i = (int) (h * 6);
    float f = h * 6 - i;
    float p = v * (1 - s);
    float q = v * (1 - f * s);
    float t = v * (1 - (1 - f) * s);

    switch (i % 6) {
      case 0: out.rgb[0] = v; out.rgb[1] = t; out.rgb[2] = p; break;
      case 1: out.rgb[0] = q; out.rgb[1] = v; out.rgb[2] = p; break;
      case 2: out.rgb[0] = p; out.rgb[1] = v; out.rgb[2] = t; break;
      case 3: out.rgb[0] = p; out.rgb[1] = q; out.rgb[2] = v; break;
      case 4: out.rgb[0] = t; out.rgb[1] = p; out.rgb[2] = v; break;
      case 5: out.rgb[0] = v; out.rgb[1] = p; out.rgb[2] = q; break;
    }

    return out;
  }